

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void free_http_proto_data(mg_connection *nc)

{
  long *__ptr;
  proto_data_http *dp;
  mg_connection *nc_local;
  
  __ptr = (long *)nc->proto_data;
  if (__ptr != (long *)0x0) {
    if (*__ptr != 0) {
      fclose((FILE *)*__ptr);
    }
    if (__ptr[4] != 0) {
      *(ulong *)(__ptr[4] + 200) = *(ulong *)(__ptr[4] + 200) | 0x800;
    }
    free(__ptr);
    nc->proto_data = (void *)0x0;
  }
  return;
}

Assistant:

static void free_http_proto_data(struct mg_connection *nc) {
    struct proto_data_http *dp = (struct proto_data_http *) nc->proto_data;
    if (dp != NULL) {
        if (dp->fp != NULL) {
            fclose(dp->fp);
        }
        if (dp->cgi_nc != NULL) {
            dp->cgi_nc->flags |= MG_F_CLOSE_IMMEDIATELY;
        }
        MG_FREE(dp);
        nc->proto_data = NULL;
    }
}